

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O3

const_reference __thiscall cmList::get_item_abi_cxx11_(cmList *this,index_type pos)

{
  pointer pbVar1;
  size_type sVar2;
  
  sVar2 = ComputeIndex(this,pos,true);
  pbVar1 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar2 < (ulong)((long)(this->Values).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    return pbVar1 + sVar2;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",sVar2);
}

Assistant:

const_reference get_item(index_type pos) const
  {
    return this->Values.at(this->ComputeIndex(pos));
  }